

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O2

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find_first_of(StringPiece *this,StringPiece s,size_type pos)

{
  long lVar1;
  size_type sVar2;
  stringpiece_ssize_type sVar3;
  bool *table;
  char *pcVar4;
  stringpiece_ssize_type i;
  StringPiece characters_wanted;
  size_type sStack_140;
  bool lookup [256];
  
  pcVar4 = (char *)s.length_;
  lVar1 = this->length_;
  table = (bool *)CONCAT71((int7)(pos >> 8),(long)pcVar4 < 1 || lVar1 < 1);
  if ((long)pcVar4 < 1 || lVar1 < 1) {
    sVar2 = 0xffffffffffffffff;
  }
  else {
    if (pcVar4 == (char *)0x1) {
      sVar3 = find(this,(char)*(protobuf *)s.ptr_,pos);
      return sVar3;
    }
    memset(lookup,0,0x100);
    characters_wanted.length_ = (stringpiece_ssize_type)lookup;
    characters_wanted.ptr_ = pcVar4;
    BuildLookupTable((protobuf *)s.ptr_,characters_wanted,table);
    sStack_140 = 0xffffffffffffffff;
    while ((sVar2 = sStack_140, (long)pos < lVar1 &&
           (sVar2 = pos, lookup[(byte)this->ptr_[pos]] == false))) {
      pos = pos + 1;
    }
  }
  return sVar2;
}

Assistant:

stringpiece_ssize_type StringPiece::find_first_of(StringPiece s,
                                                  size_type pos) const {
  if (length_ <= 0 || s.length_ <= 0) {
    return npos;
  }
  // Avoid the cost of BuildLookupTable() for a single-character search.
  if (s.length_ == 1) return find_first_of(s.ptr_[0], pos);

  bool lookup[UCHAR_MAX + 1] = { false };
  BuildLookupTable(s, lookup);
  for (stringpiece_ssize_type i = pos; i < length_; ++i) {
    if (lookup[static_cast<unsigned char>(ptr_[i])]) {
      return i;
    }
  }
  return npos;
}